

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCone.c
# Opt level: O2

int Gia_ManCountFlops(Gia_Man_t *p,Vec_Int_t *vOuts)

{
  int iVar1;
  Vec_Int_t *p_00;
  Gia_Obj_t *pGVar2;
  int iVar3;
  
  p_00 = Vec_IntAlloc(100);
  for (iVar3 = 0; iVar3 < vOuts->nSize; iVar3 = iVar3 + 1) {
    iVar1 = Vec_IntEntry(vOuts,iVar3);
    pGVar2 = Gia_ManPo(p,iVar1);
    iVar1 = Gia_ObjId(p,pGVar2);
    Vec_IntPush(p_00,iVar1);
  }
  Gia_ManIncrementTravId(p);
  Gia_ObjSetTravIdCurrent(p,p->pObjs);
  iVar3 = 0;
  do {
    if (p_00->nSize <= iVar3) break;
    iVar1 = Vec_IntEntry(p_00,iVar3);
    pGVar2 = Gia_ManObj(p,iVar1);
    if (pGVar2 == (Gia_Obj_t *)0x0) break;
    iVar1 = Gia_ManConeMark_rec(p,pGVar2,p_00,1000000000);
    iVar3 = iVar3 + 1;
  } while (iVar1 == 0);
  iVar3 = p_00->nSize;
  iVar1 = vOuts->nSize;
  Vec_IntFree(p_00);
  return iVar3 - iVar1;
}

Assistant:

int Gia_ManCountFlops( Gia_Man_t * p, Vec_Int_t * vOuts )
{
    int Limit = ABC_INFINITY;
    Vec_Int_t * vRoots;
    Gia_Obj_t * pObj;
    int i, RetValue, iOut;
    // start the outputs
    vRoots = Vec_IntAlloc( 100 );
    Vec_IntForEachEntry( vOuts, iOut, i )
    {
        pObj = Gia_ManPo( p, iOut );
        Vec_IntPush( vRoots, Gia_ObjId(p, pObj) );
    }
    // mark internal nodes
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrent( p, Gia_ManConst0(p) );
    Gia_ManForEachObjVec( vRoots, p, pObj, i )
        if ( Gia_ManConeMark_rec( p, pObj, vRoots, Limit ) )
            break;
    RetValue = Vec_IntSize( vRoots ) - Vec_IntSize(vOuts);
    Vec_IntFree( vRoots );
    return RetValue;
}